

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O2

bool google::protobuf::internal::
     AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>>
               (RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *t)

{
  int iVar1;
  Type *pTVar2;
  int iVar3;
  
  iVar1 = (t->super_RepeatedPtrFieldBase).current_size_;
  do {
    iVar3 = iVar1;
    if (iVar3 < 1) break;
    pTVar2 = RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                       (&t->super_RepeatedPtrFieldBase,iVar3 + -1);
    iVar1 = iVar3 + -1;
  } while ((~(pTVar2->_has_bits_).has_bits_[0] & 3) == 0);
  return iVar3 < 1;
}

Assistant:

bool AllAreInitialized(const Type& t) {
  for (int i = t.size(); --i >= 0; ) {
    if (!t.Get(i).IsInitialized()) return false;
  }
  return true;
}